

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

RPCHelpMan * getnodeaddresses(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_07;
  string description_08;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff128;
  undefined8 in_stack_fffffffffffff138;
  undefined8 in_stack_fffffffffffff140;
  undefined8 in_stack_fffffffffffff148;
  code *pcVar8;
  undefined8 in_stack_fffffffffffff150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff158;
  pointer in_stack_fffffffffffff168;
  pointer pRVar9;
  pointer in_stack_fffffffffffff170;
  pointer pRVar10;
  pointer in_stack_fffffffffffff178;
  pointer pRVar11;
  _Vector_impl_data in_stack_fffffffffffff180;
  pointer in_stack_fffffffffffff198;
  pointer pRVar12;
  pointer in_stack_fffffffffffff1a0;
  pointer pRVar13;
  pointer in_stack_fffffffffffff1a8;
  pointer pRVar14;
  undefined8 in_stack_fffffffffffff1b0;
  pointer in_stack_fffffffffffff1b8;
  pointer in_stack_fffffffffffff1c0;
  pointer in_stack_fffffffffffff1c8;
  undefined8 in_stack_fffffffffffff1d0;
  pointer in_stack_fffffffffffff1d8;
  pointer in_stack_fffffffffffff1e0;
  pointer in_stack_fffffffffffff1e8;
  undefined8 in_stack_fffffffffffff1f0;
  pointer in_stack_fffffffffffff1f8;
  pointer in_stack_fffffffffffff200;
  pointer in_stack_fffffffffffff208;
  vector<RPCResult,_std::allocator<RPCResult>_> local_df0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_dd8;
  RPCResults local_dc0;
  allocator_type local_da1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_da0;
  int local_d84;
  vector<RPCArg,_std::allocator<RPCArg>_> local_d80;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  ulong *local_b28;
  undefined8 local_b20;
  ulong local_b18;
  undefined8 uStack_b10;
  ulong *local_b08;
  size_type local_b00;
  ulong local_af8;
  undefined8 uStack_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  size_type *local_aa8;
  size_type local_aa0;
  size_type local_a98;
  undefined8 uStack_a90;
  long *local_a88 [2];
  long local_a78 [2];
  long *local_a68 [2];
  long local_a58 [2];
  long *local_a48 [2];
  long local_a38 [2];
  long *local_a28 [2];
  long local_a18 [2];
  long *local_a08 [2];
  long local_9f8 [2];
  long *local_9e8 [2];
  long local_9d8 [2];
  long *local_9c8 [2];
  long local_9b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  size_type *local_988;
  size_type local_980;
  size_type local_978 [2];
  long *local_968 [2];
  long local_958 [2];
  RPCResult local_948;
  RPCResult local_8c0;
  RPCResult local_838;
  RPCResult local_7b0;
  RPCResult local_728;
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  RPCResult local_660;
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  RPCResult local_598;
  undefined1 local_510;
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8;
  undefined7 uStack_4f7;
  undefined1 local_4e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  size_type *local_488;
  size_type local_480;
  size_type local_478;
  undefined8 uStack_470;
  undefined1 *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  undefined8 uStack_450;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_448;
  undefined1 local_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  undefined1 local_3c8;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 local_3a0 [32];
  long *local_380 [2];
  long local_370;
  undefined1 auStack_368 [8];
  undefined1 local_360 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<UniValue,_std::allocator<UniValue>_> local_320;
  undefined1 local_308 [40];
  long local_2e0 [6];
  __index_type local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getnodeaddresses","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Return known addresses, after filtering for quality and recency.\nThese can potentially be used to find new peers in the network.\nThe total number of addresses known to the node may be higher."
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"count","");
  local_d84 = 1;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_360,&local_d84);
  local_308._8_8_ = local_308 + 0x18;
  local_308._0_4_ = local_360._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ == &local_348) {
    local_308._32_8_ = local_348._8_8_;
  }
  else {
    local_308._8_8_ = local_360._8_8_;
  }
  local_308._16_8_ = local_360._16_8_;
  local_360._16_8_ = 0;
  local_348._M_local_buf[0] = '\0';
  local_2e0[0] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_2e0[1] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e0[2] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0[3]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_2e0[3]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_2e0[4]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_2e0[4]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_2e0[5] = (long)local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b0 = '\x02';
  local_380[0] = &local_370;
  local_360._8_8_ = &local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,
             "The maximum number of addresses to return. Specify 0 to return all known addresses.",
             "");
  local_3c0 = &local_3b0;
  local_3c8 = 0;
  local_3b8 = 0;
  local_3b0 = 0;
  local_3a0._0_8_ = (pointer)0x0;
  local_3a0._8_2_ = 0;
  local_3a0._10_6_ = 0;
  local_3a0._16_2_ = 0;
  local_3a0._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  name.field_2._8_8_ = in_stack_fffffffffffff140;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff150;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff148;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff158;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff168;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff170;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff178;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff180._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff180._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff180._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff198;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff1a0;
  description_07._M_string_length = in_stack_fffffffffffff1b0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1a8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1b8;
  description_07.field_2._8_8_ = in_stack_fffffffffffff1c0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d0;
  opts._0_8_ = in_stack_fffffffffffff1c8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff1d8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1e0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff1f0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff1f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff200;
  opts._64_8_ = in_stack_fffffffffffff208;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_07,opts);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"network","");
  local_468 = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"all networks","");
  local_448._0_8_ = (long)&local_448 + 0x10;
  if (local_468 == &local_458) {
    local_448._24_8_ = uStack_450;
  }
  else {
    local_448._0_8_ = local_468;
  }
  local_448._8_8_ = local_460;
  local_460 = 0;
  local_458 = 0;
  local_3f0 = 1;
  local_468 = &local_458;
  GetNetworkNames_abi_cxx11_(&local_da0,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_4c8,(util *)&local_da0,", ");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_4c8,0,0,
                      "Return only addresses of the specified network. Can be one of: ",0x3f);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_4a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_4a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_4a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_4a8._M_dataplus._M_p = (pointer)paVar5;
  }
  local_4a8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_4a8,".");
  local_488 = &local_478;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar5) {
    local_478 = paVar5->_M_allocated_capacity;
    uStack_470 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_478 = paVar5->_M_allocated_capacity;
    local_488 = psVar1;
  }
  local_480 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_508 = &local_4f8;
  local_510 = 0;
  local_500 = 0;
  local_4f8 = 0;
  local_4e8._0_8_ = (pointer)0x0;
  local_4e8._8_2_ = 0;
  local_4e8._10_6_ = 0;
  local_4e8._16_2_ = 0;
  local_4e8._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  name_00.field_2._8_8_ = in_stack_fffffffffffff140;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff150;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff148;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff158;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff168;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff170;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff178;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff180._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff180._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff180._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff198;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff1a0;
  description_08._M_string_length = in_stack_fffffffffffff1b0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1a8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1b8;
  description_08.field_2._8_8_ = in_stack_fffffffffffff1c0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d0;
  opts_00._0_8_ = in_stack_fffffffffffff1c8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff1d8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1e0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1e8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff1f0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff1f8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff200;
  opts_00._64_8_ = in_stack_fffffffffffff208;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_3e8,fallback_00,description_08,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_d80,__l,&local_da1);
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"time","");
  std::operator+(&local_9a8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_9a8," when the node was last seen");
  local_988 = local_978;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar5) {
    local_978[0] = paVar5->_M_allocated_capacity;
    local_978[1] = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_978[0] = paVar5->_M_allocated_capacity;
    local_988 = psVar1;
  }
  local_980 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff140;
  description._M_string_length = in_stack_fffffffffffff150;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description.field_2 = in_stack_fffffffffffff158;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff170;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff168;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff178;
  RPCResult::RPCResult(&local_948,NUM_TIME,m_key_name,description,inner,SUB81(local_968,0));
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"services","");
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e8,"The services offered by the node","");
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff140;
  description_00._M_string_length = in_stack_fffffffffffff150;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_00.field_2 = in_stack_fffffffffffff158;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff170;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff168;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff178;
  RPCResult::RPCResult(&local_8c0,NUM,m_key_name_00,description_00,inner_00,SUB81(local_9c8,0));
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"address","");
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"The address of the node","");
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff140;
  description_01._M_string_length = in_stack_fffffffffffff150;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_01.field_2 = in_stack_fffffffffffff158;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff170;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff168;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff178;
  RPCResult::RPCResult(&local_838,STR,m_key_name_01,description_01,inner_01,SUB81(local_a08,0));
  local_a48[0] = local_a38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"port","");
  local_a68[0] = local_a58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a68,"The port number of the node","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff140;
  description_02._M_string_length = in_stack_fffffffffffff150;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_02.field_2 = in_stack_fffffffffffff158;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff170;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff168;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff178;
  RPCResult::RPCResult(&local_7b0,NUM,m_key_name_02,description_02,inner_02,SUB81(local_a48,0));
  local_a88[0] = local_a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"network","");
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff180,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_ae8,(util *)&stack0xfffffffffffff180,", ");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_ae8,0,0,"The network (",0xd);
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_ac8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_ac8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_ac8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_ac8._M_dataplus._M_p = (pointer)paVar5;
  }
  local_ac8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_ac8,") the node connected through");
  local_aa8 = &local_a98;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar5) {
    local_a98 = paVar5->_M_allocated_capacity;
    uStack_a90 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_a98 = paVar5->_M_allocated_capacity;
    local_aa8 = psVar1;
  }
  local_aa0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pRVar11 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff140;
  description_03._M_string_length = in_stack_fffffffffffff150;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_03.field_2 = in_stack_fffffffffffff158;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_728,STR,m_key_name_03,description_03,inner_03,SUB81(local_a88,0));
  __l_00._M_len = 5;
  __l_00._M_array = &local_948;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_df0,__l_00,(allocator_type *)&stack0xfffffffffffff167);
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff140;
  description_04._M_string_length = in_stack_fffffffffffff150;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff158._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_660,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_680,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_dd8,__l_01,(allocator_type *)&stack0xfffffffffffff166);
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff128;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff138;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff140;
  description_05._M_string_length = in_stack_fffffffffffff150;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff148;
  description_05.field_2 = in_stack_fffffffffffff158;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_598,ARR,m_key_name_05,description_05,inner_05,SUB81(local_5b8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff128;
  result.m_key_name._M_string_length = in_stack_fffffffffffff138;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff140;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff148;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff150;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff158;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)pRVar10;
  result.m_description._M_string_length = (size_type)pRVar11;
  result._88_24_ = in_stack_fffffffffffff180;
  result.m_cond._M_string_length = (size_type)pRVar12;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar13;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_dc0,result);
  local_bc8._M_dataplus._M_p = (pointer)&local_bc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc8,"getnodeaddresses","");
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"8","");
  HelpExampleCli(&local_ba8,&local_bc8,&local_be8);
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"getnodeaddresses","");
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"4 \"i2p\"","");
  HelpExampleCli(&local_c08,&local_c28,&local_c48);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    uVar6 = local_ba8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_c08._M_string_length + local_ba8._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
      uVar6 = local_c08.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_c08._M_string_length + local_ba8._M_string_length) goto LAB_00a4500d;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_c08,0,0,local_ba8._M_dataplus._M_p,local_ba8._M_string_length);
  }
  else {
LAB_00a4500d:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_ba8,local_c08._M_dataplus._M_p,local_c08._M_string_length);
  }
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_b88.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b88.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_b88.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
  }
  else {
    local_b88.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b88._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b88._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"-named getnodeaddresses","")
  ;
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"network=onion count=12","");
  HelpExampleCli(&local_c68,&local_c88,&local_ca8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    uVar6 = local_b88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_c68._M_string_length + local_b88._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
      uVar6 = local_c68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_c68._M_string_length + local_b88._M_string_length) goto LAB_00a45145;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_c68,0,0,local_b88._M_dataplus._M_p,local_b88._M_string_length);
  }
  else {
LAB_00a45145:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b88,local_c68._M_dataplus._M_p,local_c68._M_string_length);
  }
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_b68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b68.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_b68.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
  }
  else {
    local_b68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b68._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b68._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"getnodeaddresses","");
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"8","");
  HelpExampleRpc(&local_cc8,&local_ce8,&local_d08);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    uVar6 = local_b68.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_cc8._M_string_length + local_b68._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
      uVar6 = local_cc8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_cc8._M_string_length + local_b68._M_string_length) goto LAB_00a4527d;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_cc8,0,0,local_b68._M_dataplus._M_p,local_b68._M_string_length);
  }
  else {
LAB_00a4527d:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b68,local_cc8._M_dataplus._M_p,local_cc8._M_string_length);
  }
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_b48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b48.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_b48.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
  }
  else {
    local_b48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b48._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b48._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d48,"getnodeaddresses","");
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"4, \"i2p\"","");
  HelpExampleRpc(&local_d28,&local_d48,&local_d68);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    uVar6 = local_b48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_d28._M_string_length + local_b48._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
      uVar6 = local_d28.field_2._M_allocated_capacity;
    }
    if (local_d28._M_string_length + local_b48._M_string_length <= (ulong)uVar6) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d28,0,0,local_b48._M_dataplus._M_p,local_b48._M_string_length);
      goto LAB_00a453d5;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b48,local_d28._M_dataplus._M_p,local_d28._M_string_length);
LAB_00a453d5:
  local_b28 = &local_b18;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar5) {
    local_b18 = paVar5->_M_allocated_capacity;
    uStack_b10 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_b18 = paVar5->_M_allocated_capacity;
    local_b28 = puVar2;
  }
  local_b00 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  if (local_b28 == &local_b18) {
    uStack_af0 = uStack_b10;
    local_b08 = &local_af8;
  }
  else {
    local_b08 = local_b28;
  }
  local_af8 = local_b18;
  local_b20 = 0;
  local_b18 = local_b18 & 0xffffffffffffff00;
  pcVar8 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:929:9)>
           ::_M_manager;
  description_06._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:929:9)>
       ::_M_invoke;
  description_06._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:929:9)>
                ::_M_manager;
  description_06.field_2 = in_stack_fffffffffffff158;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  examples.m_examples._M_string_length = (size_type)pRVar13;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff1b0;
  local_b28 = &local_b18;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff138)),description_06,args,
             (RPCResults)in_stack_fffffffffffff180,examples,(RPCMethodImpl *)&local_58);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffff138,&stack0xfffffffffffff138,3);
  }
  if (local_b08 != &local_af8) {
    operator_delete(local_b08,local_af8 + 1);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28,local_b18 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p,local_d68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p,local_b48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
    operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p,local_b68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p,local_c68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p,local_c88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p,local_c08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p,local_ba8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc8._M_dataplus._M_p != &local_bc8.field_2) {
    operator_delete(local_bc8._M_dataplus._M_p,local_bc8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_dc0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_cond._M_dataplus._M_p != &local_598.m_cond.field_2) {
    operator_delete(local_598.m_cond._M_dataplus._M_p,
                    local_598.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_description._M_dataplus._M_p != &local_598.m_description.field_2) {
    operator_delete(local_598.m_description._M_dataplus._M_p,
                    local_598.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_598.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_key_name._M_dataplus._M_p != &local_598.m_key_name.field_2) {
    operator_delete(local_598.m_key_name._M_dataplus._M_p,
                    local_598.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_dd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_cond._M_dataplus._M_p != &local_660.m_cond.field_2) {
    operator_delete(local_660.m_cond._M_dataplus._M_p,
                    local_660.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_description._M_dataplus._M_p != &local_660.m_description.field_2) {
    operator_delete(local_660.m_description._M_dataplus._M_p,
                    local_660.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_key_name._M_dataplus._M_p != &local_660.m_key_name.field_2) {
    operator_delete(local_660.m_key_name._M_dataplus._M_p,
                    local_660.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_df0);
  lVar7 = 0x2a8;
  do {
    if ((long *)((long)local_958 + lVar7) != *(long **)((long)local_968 + lVar7)) {
      operator_delete(*(long **)((long)local_968 + lVar7),*(long *)((long)local_958 + lVar7) + 1);
    }
    if ((long *)((long)local_978 + lVar7) != *(long **)((long)&local_988 + lVar7)) {
      operator_delete(*(long **)((long)&local_988 + lVar7),*(long *)((long)local_978 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_9a8._M_dataplus._M_p + lVar7));
    if ((long *)((long)local_9b8 + lVar7) != *(long **)((long)local_9c8 + lVar7)) {
      operator_delete(*(long **)((long)local_9c8 + lVar7),*(long *)((long)local_9b8 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff168);
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8,local_a98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff180);
  if (local_a88[0] != local_a78) {
    operator_delete(local_a88[0],local_a78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff198);
  if (local_a68[0] != local_a58) {
    operator_delete(local_a68[0],local_a58[0] + 1);
  }
  if (local_a48[0] != local_a38) {
    operator_delete(local_a48[0],local_a38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1b8);
  if (local_a28[0] != local_a18) {
    operator_delete(local_a28[0],local_a18[0] + 1);
  }
  if (local_a08[0] != local_9f8) {
    operator_delete(local_a08[0],local_9f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1d8);
  if (local_9e8[0] != local_9d8) {
    operator_delete(local_9e8[0],local_9d8[0] + 1);
  }
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0],local_9b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1f8);
  if (local_988 != local_978) {
    operator_delete(local_988,local_978[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_d80);
  lVar7 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    if ((long *)(local_308 + lVar7 + 0x50) != *(long **)(local_308 + lVar7 + 0x40)) {
      operator_delete(*(long **)(local_308 + lVar7 + 0x40),*(long *)(local_308 + lVar7 + 0x50) + 1);
    }
    if ((long *)(local_308 + lVar7 + 0x28) != *(long **)(local_308 + lVar7 + 0x18)) {
      operator_delete(*(long **)(local_308 + lVar7 + 0x18),*(long *)(local_308 + lVar7 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_360 + lVar7 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_368 + lVar7));
    if ((long *)((long)local_380 + lVar7) != *(long **)(local_3a0 + lVar7 + 0x10)) {
      operator_delete(*(long **)(local_3a0 + lVar7 + 0x10),*(long *)((long)local_380 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  if (local_508 != &local_4f8) {
    operator_delete(local_508,CONCAT71(uStack_4f7,local_4f8) + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_448._M_first);
  if (local_468 != &local_458) {
    operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a0);
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
  }
  if (local_380[0] != &local_370) {
    operator_delete(local_380[0],local_370 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_308);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ != &local_348) {
    operator_delete((void *)local_360._8_8_,
                    CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1);
  }
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnodeaddresses()
{
    return RPCHelpMan{"getnodeaddresses",
                "Return known addresses, after filtering for quality and recency.\n"
                "These can potentially be used to find new peers in the network.\n"
                "The total number of addresses known to the node may be higher.",
                {
                    {"count", RPCArg::Type::NUM, RPCArg::Default{1}, "The maximum number of addresses to return. Specify 0 to return all known addresses."},
                    {"network", RPCArg::Type::STR, RPCArg::DefaultHint{"all networks"}, "Return only addresses of the specified network. Can be one of: " + Join(GetNetworkNames(), ", ") + "."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                            {RPCResult::Type::NUM, "services", "The services offered by the node"},
                            {RPCResult::Type::STR, "address", "The address of the node"},
                            {RPCResult::Type::NUM, "port", "The port number of the node"},
                            {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") the node connected through"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getnodeaddresses", "8")
                    + HelpExampleCli("getnodeaddresses", "4 \"i2p\"")
                    + HelpExampleCli("-named getnodeaddresses", "network=onion count=12")
                    + HelpExampleRpc("getnodeaddresses", "8")
                    + HelpExampleRpc("getnodeaddresses", "4, \"i2p\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    const int count{request.params[0].isNull() ? 1 : request.params[0].getInt<int>()};
    if (count < 0) throw JSONRPCError(RPC_INVALID_PARAMETER, "Address count out of range");

    const std::optional<Network> network{request.params[1].isNull() ? std::nullopt : std::optional<Network>{ParseNetwork(request.params[1].get_str())}};
    if (network == NET_UNROUTABLE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Network not recognized: %s", request.params[1].get_str()));
    }

    // returns a shuffled list of CAddress
    const std::vector<CAddress> vAddr{connman.GetAddresses(count, /*max_pct=*/0, network)};
    UniValue ret(UniValue::VARR);

    for (const CAddress& addr : vAddr) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(addr.nTime)});
        obj.pushKV("services", (uint64_t)addr.nServices);
        obj.pushKV("address", addr.ToStringAddr());
        obj.pushKV("port", addr.GetPort());
        obj.pushKV("network", GetNetworkName(addr.GetNetClass()));
        ret.push_back(std::move(obj));
    }
    return ret;
},
    };
}